

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_file_system.cpp
# Opt level: O2

unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> __thiscall
duckdb::VirtualFileSystem::ExtractSubSystem(VirtualFileSystem *this,string *name)

{
  _Head_base<0UL,_duckdb::FileSystem_*,_false> _Var1;
  __type _Var2;
  iterator iVar3;
  pointer pFVar4;
  key_type *in_RDX;
  const_iterator __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar3 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  *)((long)&name[2].field_2 + 8),in_RDX);
  if (iVar3.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    for (__position._M_current =
              (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> *)
              name->_M_string_length;
        __position._M_current !=
        (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> *)
        (name->field_2)._M_allocated_capacity; __position._M_current = __position._M_current + 1) {
      pFVar4 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
               operator->(__position._M_current);
      (*pFVar4->_vptr_FileSystem[0x27])(&local_50,pFVar4);
      _Var2 = ::std::operator==(&local_50,in_RDX);
      ::std::__cxx11::string::~string((string *)&local_50);
      if (_Var2) {
        _Var1._M_head_impl =
             ((__position._M_current)->
             super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)._M_t.
             super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
             super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
        ((__position._M_current)->
        super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)._M_t.
        super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
        super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl = (FileSystem *)0x0;
        std::
        vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
        ::erase((vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
                 *)&name->_M_string_length,__position);
        (this->super_FileSystem)._vptr_FileSystem = (_func_int **)_Var1._M_head_impl;
        return (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)
               (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)this;
      }
    }
  }
  (this->super_FileSystem)._vptr_FileSystem = (_func_int **)0x0;
  return (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)
         (unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)this;
}

Assistant:

unique_ptr<FileSystem> VirtualFileSystem::ExtractSubSystem(const string &name) {
	// If the subsystem has been disabled, we don't allow extraction and return nullptr here.
	if (disabled_file_systems.find(name) != disabled_file_systems.end()) {
		return nullptr;
	}

	unique_ptr<FileSystem> extracted_filesystem;
	for (auto iter = sub_systems.begin(); iter != sub_systems.end(); ++iter) {
		auto &cur_filesystem = *iter;
		if (cur_filesystem->GetName() == name) {
			extracted_filesystem = std::move(cur_filesystem);
			sub_systems.erase(iter);
			return extracted_filesystem;
		}
	}

	// Requested subfilesystem is not registered.
	return nullptr;
}